

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O1

int genBiomeNoiseScaled(BiomeNoise *bn,int *out,Range r,uint64_t sha)

{
  Range RVar1;
  Range r_00;
  undefined1 auVar2 [20];
  Range r_01;
  undefined1 auVar3 [12];
  int iVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  int *out_00;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int y4;
  int z4;
  int x4;
  Range s;
  undefined8 in_stack_ffffffffffffff84;
  int local_6c;
  int local_68;
  int local_64;
  BiomeNoise *local_60;
  undefined4 local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  int local_48;
  int local_44;
  undefined4 uStack_40;
  uint64_t local_38;
  
  RVar1 = r;
  if (r.sy == 0) {
    r.sy = 1;
  }
  local_60 = bn;
  local_38 = sha;
  if (r.scale == 1) {
    uVar11 = (long)r.sz * (long)r.sy * (long)r.sx;
    r_01.sz = r.sy;
    r_01.sx = r.y;
    auVar3 = RVar1._8_12_;
    r_01.scale = auVar3._0_4_;
    r_01.x = auVar3._4_4_;
    r_01.z = auVar3._8_4_;
    r_01._20_8_ = in_stack_ffffffffffffff84;
    getVoronoiSrcRange(r_01);
    if (uVar11 < 2) {
      out_00 = (int *)0x0;
    }
    else {
      out_00 = out + uVar11;
      RVar1.sy = uStack_40;
      RVar1.y = local_44;
      RVar1.x = iStack_54;
      RVar1.scale = local_58;
      RVar1.z = iStack_50;
      RVar1.sx = iStack_4c;
      RVar1.sz = local_48;
      genBiomeNoise3D(local_60,out_00,RVar1,0);
    }
    if (0 < r.sy) {
      iVar9 = 0;
      do {
        if (0 < r.sz) {
          iVar7 = 0;
          do {
            if (0 < r.sx) {
              iVar10 = 0;
              do {
                voronoiAccess3D(local_38,r.x + iVar10,r.y + iVar9,r.z + iVar7,&local_64,&local_6c,
                                &local_68);
                if (out_00 == (int *)0x0) {
                  iVar4 = sampleBiomeNoise(local_60,(int64_t *)0x0,local_64,local_6c,local_68,
                                           (uint64_t *)0x0,0);
                }
                else {
                  lVar5 = (long)local_64;
                  local_64 = (int)(lVar5 - iStack_54);
                  lVar6 = (long)local_6c;
                  local_6c = (int)(lVar6 - local_44);
                  lVar8 = (long)local_68;
                  local_68 = (int)(lVar8 - iStack_50);
                  iVar4 = out_00[((long)local_48 * (lVar6 - local_44) + (lVar8 - iStack_50)) *
                                 (long)iStack_4c + (lVar5 - iStack_54)];
                }
                *out = iVar4;
                out = out + 1;
                iVar10 = iVar10 + 1;
              } while (iVar10 < r.sx);
            }
            iVar7 = iVar7 + 1;
          } while (iVar7 < r.sz);
        }
        iVar9 = iVar9 + 1;
      } while (iVar9 < r.sy);
    }
  }
  else {
    r_00.sy = r.sy;
    r_00.y = r.y;
    auVar2 = RVar1._0_20_;
    r_00.scale = auVar2._0_4_;
    r_00.x = auVar2._4_4_;
    r_00.z = auVar2._8_4_;
    r_00.sx = auVar2._12_4_;
    r_00.sz = auVar2._16_4_;
    genBiomeNoise3D(bn,out,r_00,(uint)(4 < r.scale));
  }
  return 0;
}

Assistant:

int genBiomeNoiseScaled(const BiomeNoise *bn, int *out, Range r, uint64_t sha)
{
    if (r.sy == 0)
        r.sy = 1;

    uint64_t siz = (uint64_t)r.sx*r.sy*r.sz;
    int i, j, k;

    if (r.scale == 1)
    {
        Range s = getVoronoiSrcRange(r);
        int *src;
        if (siz > 1)
        {   // the source range is large enough that we can try optimizing
            src = out + siz;
            genBiomeNoise3D(bn, src, s, 0);
        }
        else
        {
            src = NULL;
        }

        int *p = out;
        for (k = 0; k < r.sy; k++)
        {
            for (j = 0; j < r.sz; j++)
            {
                for (i = 0; i < r.sx; i++)
                {
                    int x4, z4, y4;
                    voronoiAccess3D(sha, r.x+i, r.y+k, r.z+j, &x4, &y4, &z4);
                    if (src)
                    {
                        x4 -= s.x; y4 -= s.y; z4 -= s.z;
                        *p = src[(int64_t)y4*s.sx*s.sz + (int64_t)z4*s.sx + x4];
                    }
                    else
                    {
                        *p = sampleBiomeNoise(bn, 0, x4, y4, z4, 0, 0);
                    }
                    p++;
                }
            }
        }
    }
    else
    {
        // There is (was?) an optimization that causes MC-241546, and should
        // not be enabled for accurate results. However, if the scale is higher
        // than 1:4, the accuracy becomes questionable anyway. Furthermore
        // situations that want to use a higher scale are usually better off
        // with a faster, if imperfect, result.
        genBiomeNoise3D(bn, out, r, r.scale > 4);
    }
    return 0;
}